

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

uint64_t ssl_load_six_bytes(uchar *buf)

{
  return (ulong)buf[5] |
         (ulong)buf[4] << 8 |
         (ulong)buf[3] << 0x10 | (ulong)buf[2] << 0x18 | (ulong)buf[1] << 0x20 | (ulong)*buf << 0x28
  ;
}

Assistant:

static inline uint64_t ssl_load_six_bytes( unsigned char *buf )
{
    return( ( (uint64_t) buf[0] << 40 ) |
            ( (uint64_t) buf[1] << 32 ) |
            ( (uint64_t) buf[2] << 24 ) |
            ( (uint64_t) buf[3] << 16 ) |
            ( (uint64_t) buf[4] <<  8 ) |
            ( (uint64_t) buf[5]       ) );
}